

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O1

int XUtf8Tolower(int ucs)

{
  uint uVar1;
  ulong uVar2;
  unsigned_short *puVar3;
  
  if (ucs < 0x2b7) {
    if (ucs < 0x41) {
      return ucs;
    }
    uVar2 = (ulong)(ucs - 0x41);
    puVar3 = ucs_table_0041;
  }
  else {
    if (0x556 < ucs) {
      if (ucs < 0x10c6) {
        if (ucs < 0x10a0) {
          return ucs;
        }
        uVar2 = (ulong)(ucs - 0x10a0);
        puVar3 = ucs_table_10A0;
      }
      else {
        if (ucs < 0x1ffd) {
          if (ucs < 0x1e00) {
            return ucs;
          }
          uVar2 = (ulong)(ucs - 0x1e00);
          puVar3 = ucs_table_1E00;
          goto LAB_001fb246;
        }
        if (ucs < 0x2134) {
          if (ucs < 0x2102) {
            return ucs;
          }
          if ((ucs != 0x2130) && (ucs != 0x2112)) {
            return ucs;
          }
          uVar2 = (ulong)(ucs - 0x2102);
          puVar3 = ucs_table_2102;
        }
        else {
          if (0x24cf < ucs) {
            if (0x19 < ucs - 0xff21U) {
              return ucs;
            }
            return (int)ucs_table_FF21[ucs - 0xff21U];
          }
          if (ucs < 0x24b6) {
            return ucs;
          }
          uVar2 = (ulong)(ucs - 0x24b6);
          puVar3 = ucs_table_24B6;
        }
      }
      return (int)puVar3[uVar2];
    }
    if (ucs < 0x386) {
      return ucs;
    }
    uVar2 = (ulong)(ucs - 0x386);
    puVar3 = ucs_table_0386;
  }
LAB_001fb246:
  uVar1 = (uint)puVar3[uVar2];
  if (puVar3[uVar2] == 0) {
    uVar1 = ucs;
  }
  return uVar1;
}

Assistant:

int 
XUtf8Tolower(int ucs) {
  int ret;
  if (ucs <= 0x02B6) {
    if (ucs >= 0x0041) {
      ret = ucs_table_0041[ucs - 0x0041];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x0556) {
    if (ucs >= 0x0386) {
      ret = ucs_table_0386[ucs - 0x0386];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x10C5) {
    if (ucs >= 0x10A0) {
      ret = ucs_table_10A0[ucs - 0x10A0];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x1FFC) {
    if (ucs >= 0x1E00) {
      ret = ucs_table_1E00[ucs - 0x1E00];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x2133) {
    if (ucs >= 0x2102) {
      ret = ucs_table_2102[ucs - 0x2102];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x24CF) {
    if (ucs >= 0x24B6) {
      ret = ucs_table_24B6[ucs - 0x24B6];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x33CE) {
    if (ucs >= 0x33CE) {
      ret = ucs_table_33CE[ucs - 0x33CE];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0xFF3A) {
    if (ucs >= 0xFF21) {
      ret = ucs_table_FF21[ucs - 0xFF21];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  return ucs;
}